

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

Abc_Obj_t * Io_MvParseAddResetCircuit(Io_MvMod_t *p,char *pName)

{
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  char *pcVar3;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  void *pvVar4;
  Io_MvVar_t *pIVar5;
  Io_MvVar_t *pV;
  Abc_Obj_t *pFanin;
  Io_MvVar_t *pVar;
  Abc_Obj_t *pOutNet;
  Abc_Obj_t *pResetLONet;
  Abc_Obj_t *pData1Net;
  Abc_Obj_t *pData0Net;
  Abc_Obj_t *pNode;
  char Buffer [50];
  char *pName_local;
  Io_MvMod_t *p_local;
  
  if (p->pResetLatch != (Abc_Obj_t *)0x0) {
    pAVar2 = Abc_ObjFanout0(p->pResetLatch);
    pAVar2 = Abc_ObjFanout0(pAVar2);
    pObj = Abc_NtkFindOrCreateNet(p->pNtk,pName);
    pAVar1 = p->pNtk;
    pcVar3 = Abc_ObjNameSuffix(pObj,"_reset");
    pObj_00 = Abc_NtkFindOrCreateNet(pAVar1,pcVar3);
    pAVar1 = p->pNtk;
    pcVar3 = Abc_ObjNameSuffix(pObj,"_out");
    pObj_01 = Abc_NtkFindOrCreateNet(pAVar1,pcVar3);
    pvVar4 = Abc_NtkMvVar(p->pNtk);
    if (pvVar4 != (void *)0x0) {
      pIVar5 = (Io_MvVar_t *)Abc_ObjMvVar(pObj);
      pV = Abc_NtkMvVarDup(p->pNtk,pIVar5);
      Abc_ObjSetMvVar(pObj_00,pV);
      pIVar5 = Abc_NtkMvVarDup(p->pNtk,pIVar5);
      Abc_ObjSetMvVar(pObj_01,pIVar5);
    }
    pFanin = Abc_NtkCreateNode(p->pNtk);
    Abc_ObjAddFanin(pObj,pFanin);
    if (p->pMan->fBlifMv == 0) {
      pcVar3 = Abc_SopCreateMux((Mem_Flex_t *)p->pNtk->pManFunc);
      (pFanin->field_5).pData = pcVar3;
    }
    else {
      sprintf((char *)&pNode,"1 - - =1\n0 - - =2\n");
      pcVar3 = Abc_SopRegister((Mem_Flex_t *)p->pNtk->pManFunc,(char *)&pNode);
      (pFanin->field_5).pData = pcVar3;
    }
    Abc_ObjAddFanin(pFanin,pAVar2);
    Abc_ObjAddFanin(pFanin,pObj_01);
    Abc_ObjAddFanin(pFanin,pObj_00);
    return pObj_00;
  }
  __assert_fail("p->pResetLatch != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                ,0x706,"Abc_Obj_t *Io_MvParseAddResetCircuit(Io_MvMod_t *, char *)");
}

Assistant:

static Abc_Obj_t * Io_MvParseAddResetCircuit( Io_MvMod_t * p, char * pName )
{
    char Buffer[50];
    Abc_Obj_t * pNode, * pData0Net, * pData1Net, * pResetLONet, * pOutNet;
    Io_MvVar_t * pVar;
    // make sure the reset latch exists
    assert( p->pResetLatch != NULL );
    // get the reset net
    pResetLONet = Abc_ObjFanout0(Abc_ObjFanout0(p->pResetLatch));
    // get the output net
    pOutNet = Abc_NtkFindOrCreateNet( p->pNtk, pName );
    // get the data nets
    pData0Net = Abc_NtkFindOrCreateNet( p->pNtk, Abc_ObjNameSuffix(pOutNet, "_reset") );
    pData1Net = Abc_NtkFindOrCreateNet( p->pNtk, Abc_ObjNameSuffix(pOutNet, "_out") );
    // duplicate MV variables
    if ( Abc_NtkMvVar(p->pNtk) )
    {
        pVar = (Io_MvVar_t *)Abc_ObjMvVar( pOutNet );
        Abc_ObjSetMvVar( pData0Net, Abc_NtkMvVarDup(p->pNtk, pVar) );
        Abc_ObjSetMvVar( pData1Net, Abc_NtkMvVarDup(p->pNtk, pVar) );
    }
    // create the node
    pNode = Abc_NtkCreateNode( p->pNtk );
    // create the output net
    Abc_ObjAddFanin( pOutNet, pNode );
    // create the function
    if ( p->pMan->fBlifMv )
    {
//        Vec_Att_t * p = Abc_NtkMvVar( pNtk );
//        int nValues = Abc_ObjMvVarNum(pOutNet);
//        sprintf( Buffer, "2 %d %d %d\n1 - - =1\n0 - - =2\n", nValues, nValues, nValues );
        sprintf( Buffer, "1 - - =1\n0 - - =2\n" );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pNtk->pManFunc, Buffer );
    }
    else
        pNode->pData = Abc_SopCreateMux( (Mem_Flex_t *)p->pNtk->pManFunc );
    // add nets
    Abc_ObjAddFanin( pNode, pResetLONet );
    Abc_ObjAddFanin( pNode, pData1Net );
    Abc_ObjAddFanin( pNode, pData0Net );
    return pData0Net;
}